

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O1

UnicodeString *
icu_63::TimeZone::formatCustomID
          (int32_t hour,int32_t min,int32_t sec,UBool negative,UnicodeString *id)

{
  short sVar1;
  int32_t length;
  UChar local_2a;
  
  UnicodeString::unBogus(id);
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (id->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  UnicodeString::doReplace(id,0,length,L"GMT",0,3);
  if ((min != 0 || hour != 0) || sec != 0) {
    if (negative == '\0') {
      local_2a = L'+';
    }
    else {
      local_2a = L'-';
    }
    UnicodeString::doAppend(id,&local_2a,0,1);
    if (hour < 10) {
      local_2a = L'0';
    }
    else {
      local_2a = (short)((uint)hour / 10) + L'0';
    }
    UnicodeString::doAppend(id,&local_2a,0,1);
    local_2a = (short)(hour / 10) * -10 + (short)hour + L'0';
    UnicodeString::doAppend(id,&local_2a,0,1);
    local_2a = L':';
    UnicodeString::doAppend(id,&local_2a,0,1);
    if (min < 10) {
      local_2a = L'0';
    }
    else {
      local_2a = (short)((uint)min / 10) + L'0';
    }
    UnicodeString::doAppend(id,&local_2a,0,1);
    local_2a = (short)(min / 10) * -10 + (short)min + L'0';
    UnicodeString::doAppend(id,&local_2a,0,1);
    if (sec != 0) {
      local_2a = L':';
      UnicodeString::doAppend(id,&local_2a,0,1);
      if (sec < 10) {
        local_2a = L'0';
      }
      else {
        local_2a = (short)((uint)sec / 10) + L'0';
      }
      UnicodeString::doAppend(id,&local_2a,0,1);
      local_2a = (short)(sec / 10) * -10 + (short)sec + L'0';
      UnicodeString::doAppend(id,&local_2a,0,1);
    }
  }
  return id;
}

Assistant:

UnicodeString&
TimeZone::formatCustomID(int32_t hour, int32_t min, int32_t sec,
                         UBool negative, UnicodeString& id) {
    // Create time zone ID - GMT[+|-]hhmm[ss]
    id.setTo(GMT_ID, GMT_ID_LENGTH);
    if (hour | min | sec) {
        if (negative) {
            id += (UChar)MINUS;
        } else {
            id += (UChar)PLUS;
        }

        if (hour < 10) {
            id += (UChar)ZERO_DIGIT;
        } else {
            id += (UChar)(ZERO_DIGIT + hour/10);
        }
        id += (UChar)(ZERO_DIGIT + hour%10);
        id += (UChar)COLON;
        if (min < 10) {
            id += (UChar)ZERO_DIGIT;
        } else {
            id += (UChar)(ZERO_DIGIT + min/10);
        }
        id += (UChar)(ZERO_DIGIT + min%10);

        if (sec) {
            id += (UChar)COLON;
            if (sec < 10) {
                id += (UChar)ZERO_DIGIT;
            } else {
                id += (UChar)(ZERO_DIGIT + sec/10);
            }
            id += (UChar)(ZERO_DIGIT + sec%10);
        }
    }
    return id;
}